

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Tracer.cpp
# Opt level: O0

EStatusCode __thiscall
CharStringType2Tracer::Type2Drop(CharStringType2Tracer *this,CharStringOperandList *inOperandList)

{
  allocator<char> local_39;
  string local_38;
  CharStringOperandList *local_18;
  CharStringOperandList *inOperandList_local;
  CharStringType2Tracer *this_local;
  
  local_18 = inOperandList;
  inOperandList_local = (CharStringOperandList *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"drop",&local_39);
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return eSuccess;
}

Assistant:

EStatusCode CharStringType2Tracer::Type2Drop(const CharStringOperandList& inOperandList)
{
	mPrimitiveWriter.WriteKeyword("drop");
	return eSuccess;
}